

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainwindow.cpp
# Opt level: O1

void __thiscall MainWindow::MainWindow(MainWindow *this,QWidget *parent)

{
  void **ppvVar1;
  void **ppvVar2;
  Ui_MainWindow *this_00;
  undefined4 *puVar3;
  code *local_50;
  ImplFn local_48;
  code *local_40;
  undefined8 local_38;
  QObject local_30 [8];
  QObject local_28 [8];
  
  QMainWindow::QMainWindow(&this->super_QMainWindow,parent,0);
  *(undefined ***)this = &PTR_metaObject_0010fa70;
  *(undefined ***)&this->field_0x10 = &PTR__MainWindow_0010fc28;
  this_00 = (Ui_MainWindow *)operator_new(0x70);
  this->ui = (MainWindow *)this_00;
  Ui_MainWindow::setupUi(this_00,&this->super_QMainWindow);
  ppvVar1 = *(void ***)(this->ui + 0x10);
  ppvVar2 = *(void ***)(this->ui + 0x58);
  local_40 = QAbstractButton::clicked;
  local_38 = 0;
  local_50 = GameBoard::beginNewGame;
  local_48 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QSlotObject<void_(GameBoard::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar3 + 4) = GameBoard::beginNewGame;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_28,ppvVar1,(QObject *)&local_40,ppvVar2,(QSlotObjectBase *)&local_50,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  ppvVar1 = *(void ***)(this->ui + 0x58);
  local_40 = GameBoard::gameOver;
  local_38 = 0;
  local_50 = handleGameOver;
  local_48 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QSlotObject<void_(MainWindow::*)(int),_QtPrivate::List<int>,_void>::impl;
  *(code **)(puVar3 + 4) = handleGameOver;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_30,ppvVar1,(QObject *)&local_40,(void **)this,(QSlotObjectBase *)&local_50,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  GameBoard::init(*(GameBoard **)(this->ui + 0x58),(EVP_PKEY_CTX *)0x3);
  return;
}

Assistant:

MainWindow::MainWindow(QWidget *parent)
    : QMainWindow(parent)
    , ui(new Ui::MainWindow)
{
    ui->setupUi(this);

    bool use_dialog = false; //production mode command to avoid having to use the dialog every time app is started
    if(use_dialog)
    {
        InitGameDialog dialog(this);
        if(dialog.exec() == QDialog::Rejected)
            return; //Rejected happens if user presses cancel

        ui->player1Label->setText(dialog.player1Name());
        ui->player2Label->setText(dialog.player2Name());
        ui->gameBoard->init(dialog.boardWidth());

        connect(ui->beginNewGameButton, &QPushButton::clicked, ui->gameBoard, &GameBoard::beginNewGame);
        connect(ui->gameBoard, &GameBoard::gameOver, this, &MainWindow::handleGameOver);
    }
    else // production mode
    {
        connect(ui->beginNewGameButton, &QPushButton::clicked, ui->gameBoard, &GameBoard::beginNewGame);
        connect(ui->gameBoard, &GameBoard::gameOver, this, &MainWindow::handleGameOver);
        ui->gameBoard->init(3);
    }

}